

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

rcode __thiscall olc::Renderer_OGL10::DestroyDevice(Renderer_OGL10 *this)

{
  glXMakeCurrent(this->olc_Display,0,0);
  glXDestroyContext(this->olc_Display,this->glDeviceContext);
  return OK;
}

Assistant:

olc::rcode DestroyDevice() override
		{
#if defined(OLC_PLATFORM_WINAPI)
			wglDeleteContext(glRenderContext);
#endif

#if defined(OLC_PLATFORM_X11)
			glXMakeCurrent(olc_Display, None, NULL);
			glXDestroyContext(olc_Display, glDeviceContext);
#endif

#if defined(OLC_PLATFORM_GLUT)
			glutDestroyWindow(glutGetWindow());
#endif
			return olc::rcode::OK;
		}